

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# road_network.cpp
# Opt level: O0

bool __thiscall
road_network::in_between(road_network *this,node_type start,node_type stop,node_type q)

{
  node_type node;
  bool bVar1;
  reference pvVar2;
  reference pnVar3;
  node_type local_b9;
  iterator iStack_b8;
  node_type n;
  iterator __end2;
  iterator __begin2;
  vector<node_type,_std::allocator<node_type>_> *__range2;
  vector<node_type,_std::allocator<node_type>_> vec;
  node_type current;
  undefined1 local_70 [8];
  deque<node_type,_std::allocator<node_type>_> queue;
  node_type q_local;
  node_type stop_local;
  node_type start_local;
  road_network *this_local;
  
  queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node._5_1_ = q;
  queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node._6_1_ = stop;
  queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node._7_1_ = start;
  bVar1 = are_twins(this,start,q);
  if ((bVar1) ||
     (bVar1 = are_twins(this,queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.
                             super__Deque_impl_data._M_finish._M_node._6_1_,
                        queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_node._5_1_), bVar1)) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = are_twins(this,queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.
                           super__Deque_impl_data._M_finish._M_node._7_1_,
                      queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_node._6_1_);
    if ((bVar1) ||
       ((queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.
         super__Deque_impl_data._M_finish._M_node._7_1_ ==
         queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.
         super__Deque_impl_data._M_finish._M_node._5_1_ ||
        (queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.
         super__Deque_impl_data._M_finish._M_node._6_1_ ==
         queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.
         super__Deque_impl_data._M_finish._M_node._5_1_)))) {
      this_local._7_1_ = true;
    }
    else {
      std::deque<node_type,_std::allocator<node_type>_>::deque
                ((deque<node_type,_std::allocator<node_type>_> *)local_70);
      std::deque<node_type,_std::allocator<node_type>_>::push_back
                ((deque<node_type,_std::allocator<node_type>_> *)local_70,
                 (value_type *)
                 ((long)&queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_node + 6));
      do {
        bVar1 = std::deque<node_type,_std::allocator<node_type>_>::empty
                          ((deque<node_type,_std::allocator<node_type>_> *)local_70);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        pvVar2 = std::deque<node_type,_std::allocator<node_type>_>::front
                           ((deque<node_type,_std::allocator<node_type>_> *)local_70);
        node = *pvVar2;
        std::deque<node_type,_std::allocator<node_type>_>::pop_front
                  ((deque<node_type,_std::allocator<node_type>_> *)local_70);
        if (node == queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_node._5_1_) {
          this_local._7_1_ = true;
          goto LAB_0015044d;
        }
        get_predecessors((vector<node_type,_std::allocator<node_type>_> *)&__range2,this,node);
        __end2 = std::vector<node_type,_std::allocator<node_type>_>::begin
                           ((vector<node_type,_std::allocator<node_type>_> *)&__range2);
        iStack_b8 = std::vector<node_type,_std::allocator<node_type>_>::end
                              ((vector<node_type,_std::allocator<node_type>_> *)&__range2);
        while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff48), bVar1) {
          pnVar3 = __gnu_cxx::
                   __normal_iterator<node_type_*,_std::vector<node_type,_std::allocator<node_type>_>_>
                   ::operator*(&__end2);
          local_b9 = *pnVar3;
          std::deque<node_type,_std::allocator<node_type>_>::push_back
                    ((deque<node_type,_std::allocator<node_type>_> *)local_70,&local_b9);
          __gnu_cxx::
          __normal_iterator<node_type_*,_std::vector<node_type,_std::allocator<node_type>_>_>::
          operator++(&__end2);
        }
        pvVar2 = std::deque<node_type,_std::allocator<node_type>_>::front
                           ((deque<node_type,_std::allocator<node_type>_> *)local_70);
        if (*pvVar2 ==
            queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node._7_1_) {
LAB_00150416:
          vec.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = 3;
        }
        else {
          pvVar2 = std::deque<node_type,_std::allocator<node_type>_>::front
                             ((deque<node_type,_std::allocator<node_type>_> *)local_70);
          bVar1 = are_twins(this,*pvVar2,
                            queue.super__Deque_base<node_type,_std::allocator<node_type>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_node._7_1_);
          if (bVar1) goto LAB_00150416;
          vec.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        }
        std::vector<node_type,_std::allocator<node_type>_>::~vector
                  ((vector<node_type,_std::allocator<node_type>_> *)&__range2);
      } while (vec.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ == 0);
      this_local._7_1_ = false;
LAB_0015044d:
      vec.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 1;
      std::deque<node_type,_std::allocator<node_type>_>::~deque
                ((deque<node_type,_std::allocator<node_type>_> *)local_70);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool road_network::in_between(node_type start, node_type stop, node_type q)
{
    if(are_twins(start, q) || are_twins(stop, q))
    {
        return false;
    }

    if(are_twins(start, stop) || start == q || stop == q)
    {
        return true;
    }

    std::deque<node_type> queue;
    queue.push_back(stop);

    while(!queue.empty())
    {
        node_type current = queue.front();
        queue.pop_front();

        if (current == q)
        {
            return true;
        }

        std::vector<node_type> vec = get_predecessors(current);
        for(auto n : vec)
        {
            queue.push_back(n);
        }

        if (queue.front() == start || are_twins(queue.front(), start))
        {
            break;
        }
    }
    return false;
}